

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompleter::setWidget(QCompleter *this,QWidget *widget)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0x78) == 0) || (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = *(QWidget **)(lVar1 + 0x80);
  }
  if (pQVar3 != widget) {
    this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x78);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      QObject::removeEventFilter(*(QObject **)(lVar1 + 0x80));
    }
    QWeakPointer<QObject>::assign<QObject>(this_00,&widget->super_QObject);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      QObject::installEventFilter(*(QObject **)(lVar1 + 0x80));
    }
    if (*(QWidget **)(lVar1 + 0x90) != (QWidget *)0x0) {
      QWidget::hide(*(QWidget **)(lVar1 + 0x90));
      if ((*(long *)(lVar1 + 0x78) == 0) || (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0)) {
        pQVar3 = (QWidget *)0x0;
      }
      else {
        pQVar3 = *(QWidget **)(lVar1 + 0x80);
      }
      QWidget::setFocusProxy(*(QWidget **)(lVar1 + 0x90),pQVar3);
      return;
    }
  }
  return;
}

Assistant:

void QCompleter::setWidget(QWidget *widget)
{
    Q_D(QCompleter);
    if (widget == d->widget)
        return;

    if (d->widget)
        d->widget->removeEventFilter(this);
    d->widget = widget;
    if (d->widget)
        d->widget->installEventFilter(this);

    if (d->popup) {
        d->popup->hide();
        d->popup->setFocusProxy(d->widget);
    }
}